

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int verify_string(void *buf,flatbuffers_uoffset_t end,flatbuffers_uoffset_t base,
                 flatbuffers_uoffset_t offset)

{
  int iVar1;
  flatbuffers_uoffset_t fVar2;
  uint uVar3;
  int c_2;
  int c_1;
  int c;
  flatbuffers_uoffset_t n;
  flatbuffers_uoffset_t offset_local;
  flatbuffers_uoffset_t base_local;
  flatbuffers_uoffset_t end_local;
  void *buf_local;
  
  iVar1 = check_header(end,base,offset);
  if (iVar1 == 0) {
    buf_local._4_4_ = 0x11;
  }
  else {
    fVar2 = read_uoffset(buf,offset + base);
    uVar3 = offset + base + 4;
    if (fVar2 < end - uVar3) {
      if (*(char *)((long)buf + (ulong)fVar2 + (ulong)uVar3) == '\0') {
        buf_local._4_4_ = 0;
      }
      else {
        buf_local._4_4_ = 7;
      }
    }
    else {
      buf_local._4_4_ = 8;
    }
  }
  return buf_local._4_4_;
}

Assistant:

static inline int verify_string(const void *buf, uoffset_t end, uoffset_t base, uoffset_t offset)
{
    uoffset_t n;

    verify(check_header(end, base, offset), flatcc_verify_error_string_header_out_of_range_or_unaligned);
    base += offset;
    n = read_uoffset(buf, base);
    base += offset_size;
    verify(end - base > n, flatcc_verify_error_string_out_of_range);
    verify(((uint8_t *)buf + base)[n] == 0, flatcc_verify_error_string_not_zero_terminated);
    return flatcc_verify_ok;
}